

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

char * sexp_find_module_file_raw(sexp ctx,char *file)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  size_t __n_00;
  sexp_proc2 p_Var6;
  char *__file;
  size_t __size;
  stat buf_str;
  stat local_c0;
  
  __n_00 = strlen(file);
  p_Var6 = (((ctx->value).type.setters)->value).type.finalize;
  if (((ulong)p_Var6 & 3) == 0) {
    do {
      if (*(int *)p_Var6 != 6) {
        return (char *)0x0;
      }
      lVar2 = *(long *)(p_Var6 + 8);
      lVar3 = *(long *)(lVar2 + 8);
      lVar4 = *(long *)(lVar2 + 0x10);
      __n = *(size_t *)(lVar2 + 0x18);
      cVar1 = *(char *)(__n + 0xf + lVar3 + lVar4);
      __size = (__n_00 + 2 + __n) - (ulong)(cVar1 == '/');
      __file = (char *)malloc(__size);
      if (__file == (char *)0x0) {
        return (char *)0x0;
      }
      memcpy(__file,(void *)(lVar3 + lVar4 + 0x10),__n);
      if (cVar1 != '/') {
        __file[__n] = '/';
      }
      memcpy(__file + (__size - __n_00) + -1,file,__n_00);
      __file[__size - 1] = '\0';
      iVar5 = stat(__file,&local_c0);
      if (iVar5 == 0) {
        return __file;
      }
      free(__file);
      p_Var6 = *(sexp_proc2 *)(p_Var6 + 0x10);
    } while (((ulong)p_Var6 & 3) == 0);
  }
  return (char *)0x0;
}

Assistant:

char* sexp_find_module_file_raw (sexp ctx, const char *file) {
  sexp ls;
  char *dir, *path;
  sexp_uint_t slash, dirlen, filelen, len;
#ifdef PLAN9
#define file_exists_p(path, buf) (stat(path, buf, 128) >= 0)
  unsigned char buf[128];
#else
#define file_exists_p(path, buf) (! stat(path, buf))
  struct stat buf_str;
  struct stat *buf = &buf_str;
#endif

  filelen = strlen(file);

  ls = sexp_global(ctx, SEXP_G_MODULE_PATH);
  for ( ; sexp_pairp(ls); ls=sexp_cdr(ls)) {
    dir = sexp_string_data(sexp_car(ls));
    dirlen = sexp_string_size(sexp_car(ls));
    slash = dir[dirlen-1] == '/';
    len = dirlen+filelen+2-slash;
    path = (char*) sexp_malloc(len);
    if (! path) return NULL;
    memcpy(path, dir, dirlen);
    if (! slash) path[dirlen] = '/';
    memcpy(path+len-filelen-1, file, filelen);
    path[len-1] = '\0';
    if (sexp_find_static_library(path) || file_exists_p(path, buf))
      return path;
    free(path);
  }

  return NULL;
}